

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::PFor2008::decodeArray
          (PFor2008 *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  logic_error *this_00;
  uint32_t *puVar4;
  ulong uVar5;
  size_t thisnvalue;
  size_t local_38;
  
  uVar2 = (ulong)*in;
  puVar4 = in + 1;
  *nvalue = uVar2;
  puVar3 = puVar4;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      local_38 = uVar2 - uVar5;
      uVar1 = *puVar3;
      puVar3 = puVar3 + 1;
      if (uVar1 == 8) {
        puVar3 = __decodeArray<unsigned_char>
                           (this,puVar3,(long)((long)puVar4 + (len * 4 - (long)puVar3)) >> 2,out,
                            &local_38);
      }
      else if (uVar1 == 0x10) {
        puVar3 = __decodeArray<unsigned_short>
                           (this,puVar3,(long)((long)puVar4 + (len * 4 - (long)puVar3)) >> 2,out,
                            &local_38);
      }
      else {
        if (uVar1 != 0x20) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"corrupted?");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        puVar3 = __decodeArray<unsigned_int>
                           (this,puVar3,(long)((long)puVar4 + (len * 4 - (long)puVar3)) >> 2,out,
                            &local_38);
      }
      out = out + local_38;
      uVar5 = uVar5 + local_38;
      uVar2 = *nvalue;
    } while (uVar5 < uVar2);
    *nvalue = uVar5;
  }
  return puVar3;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t len,
                              uint32_t *out, size_t &nvalue) override {
    nvalue = *in++;
    if (nvalue == 0)
      return in;
#ifndef NDEBUG
    const uint32_t *const initin = in;
#endif
    const uint32_t *const finalin = in + len;
    size_t totalnvalue(0);
    while (totalnvalue < nvalue) {
      size_t thisnvalue = nvalue - totalnvalue;
#ifndef NDEBUG
      const uint32_t *const befin(in);
#endif
      assert(finalin <= len + in);
      const uint32_t maxb = *in++;
      if (maxb == 32) {
        in = __decodeArray<uint32_t>(in, finalin - in, out, thisnvalue);
      } else if (maxb == 16) {
        in = __decodeArray<uint16_t>(in, finalin - in, out, thisnvalue);
      } else if (maxb == 8) {
        in = __decodeArray<uint8_t>(in, finalin - in, out, thisnvalue);
      } else {
        throw std::logic_error("corrupted?");
      }
      assert(in > befin);
      assert(in <= finalin);
      out += thisnvalue;
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
    }
    assert(in <= len + initin);
    assert(in <= finalin);
    nvalue = totalnvalue;
    return in;
  }